

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_routing_linux.c
# Opt level: O0

void os_routing_linux_listener_add(os_route_listener *listener)

{
  list_entity **pplVar1;
  os_route_listener *listener_local;
  
  (listener->_internal)._node.next = &_rtnetlink_listener;
  (listener->_internal)._node.prev = _rtnetlink_listener.prev;
  pplVar1 = &(_rtnetlink_listener.prev)->next;
  _rtnetlink_listener.prev = (list_entity *)listener;
  *pplVar1 = (list_entity *)listener;
  return;
}

Assistant:

void
os_routing_linux_listener_add(struct os_route_listener *listener) {
  list_add_tail(&_rtnetlink_listener, &listener->_internal._node);
}